

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetimeedit.cpp
# Opt level: O0

void __thiscall QDateTimeEdit::setCalendarPopup(QDateTimeEdit *this,bool enable)

{
  QDateTimeEditPrivate *pQVar1;
  byte in_SIL;
  QDateTimeEditPrivate *d;
  bool in_stack_00000043;
  WidgetAttribute in_stack_00000044;
  QWidget *in_stack_00000048;
  QWidget *in_stack_ffffffffffffffd8;
  
  pQVar1 = d_func((QDateTimeEdit *)0x55b085);
  if ((in_SIL & 1) != (pQVar1->calendarPopup & 1U)) {
    QWidget::setAttribute(in_stack_00000048,in_stack_00000044,in_stack_00000043);
    pQVar1->calendarPopup = (bool)(in_SIL & 1);
    (**(code **)(*(long *)&(pQVar1->super_QAbstractSpinBoxPrivate).super_QWidgetPrivate + 0x100))();
    QWidget::update(in_stack_ffffffffffffffd8);
  }
  return;
}

Assistant:

void QDateTimeEdit::setCalendarPopup(bool enable)
{
    Q_D(QDateTimeEdit);
    if (enable == d->calendarPopup)
        return;
    setAttribute(Qt::WA_MacShowFocusRect, !enable);
    d->calendarPopup = enable;
#ifdef QT_KEYPAD_NAVIGATION
    if (!enable)
        d->focusOnButton = false;
#endif
    d->updateEditFieldGeometry();
    update();
}